

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::skip
          (SimpleParser<avro::parsing::DummyHandler> *this,Decoder *d)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  int iVar1;
  _Map_pointer ppSVar2;
  undefined4 extraout_var;
  _Elt_pointer pSVar3;
  unsigned_long *puVar4;
  undefined4 extraout_var_00;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *pwVar5;
  undefined4 extraout_var_01;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar6;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar7;
  stored_head_type sVar8;
  element_type *peVar9;
  undefined8 *puVar10;
  Symbol *pSVar11;
  _Elt_pointer pSVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  _Elt_pointer pSVar16;
  pointer pSVar17;
  ulong uVar18;
  Symbol *pSVar19;
  ProductionPtr pp;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1e0 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  undefined1 local_1a8 [8];
  shared_count local_1a0;
  _func_int *local_198 [45];
  
  ppSVar2 = (this->parsingStack).c.
            super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl
            .super__Deque_impl_data._M_finish._M_node;
  uVar13 = (ulong)((long)ppSVar2 -
                  (long)(this->parsingStack).c.
                        super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
  pSVar19 = (this->parsingStack).c.
            super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  pSVar11 = (this->parsingStack).c.
            super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl
            .super__Deque_impl_data._M_finish._M_first;
  lVar14 = (long)pSVar19 - (long)pSVar11 >> 4;
  lVar15 = (long)(this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 4;
  uVar18 = ((uVar13 - 1) + (ulong)(ppSVar2 == (_Map_pointer)0x0)) * 0x20 + lVar14 + lVar15;
  if (uVar18 == 0) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Nothing to skip!","");
    std::runtime_error::runtime_error((runtime_error *)(puVar10 + 1),(string *)local_1a8);
    *puVar10 = 0x17fa60;
    puVar10[1] = 0x17fa90;
    __cxa_throw(puVar10,&Exception::typeinfo,Exception::~Exception);
  }
  if (uVar18 <= lVar14 + lVar15 + ((uVar13 - 1) + (ulong)(ppSVar2 == (_Map_pointer)0x0)) * 0x20) {
    this_00 = &this->parsingStack;
    do {
      if (pSVar19 == pSVar11) {
        pSVar19 = ppSVar2[-1] + 0x20;
      }
      switch(pSVar19[-1].kind_) {
      case sNull:
        (*d->_vptr_Decoder[3])(d);
        break;
      case sBool:
        (*d->_vptr_Decoder[4])(d);
        break;
      case sInt:
        (*d->_vptr_Decoder[5])(d);
        break;
      case sLong:
        (*d->_vptr_Decoder[6])(d);
        break;
      case sFloat:
        (*d->_vptr_Decoder[7])(d);
        break;
      case sDouble:
        (*d->_vptr_Decoder[8])(d);
        break;
      case sString:
        (*d->_vptr_Decoder[10])(d);
        break;
      case sBytes:
        (*d->_vptr_Decoder[0xc])(d);
        break;
      case sArrayStart:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        iVar1 = (*d->_vptr_Decoder[0x12])(d);
        sVar8 = CONCAT44(extraout_var_00,iVar1);
        pSVar3 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar3 == (this->parsingStack).c.
                      super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar3 = (this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (pSVar3[-1].kind_ != sRepeater) {
          throwMismatch(sRepeater,pSVar3[-1].kind_);
        }
        if (sVar8 == 0) break;
        pSVar16 = (this->parsingStack).c.
                  super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar16 ==
            (this->parsingStack).c.
            super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
LAB_00164de3:
          pSVar16 = (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
LAB_00164df3:
        ptVar7 = boost::
                 any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           (&pSVar16[-1].extra_);
        (ptVar7->super_type).head = sVar8;
        goto LAB_00165087;
      case sArrayEnd:
      case sMapEnd:
        break;
      case sMapStart:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        iVar1 = (*d->_vptr_Decoder[0x15])(d);
        sVar8 = CONCAT44(extraout_var,iVar1);
        if (sVar8 != 0) {
          pSVar16 = (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          pSVar3 = (this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first;
          pSVar12 = pSVar16;
          if (pSVar16 == pSVar3) {
            pSVar12 = (this->parsingStack).c.
                      super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (pSVar12[-1].kind_ != sRepeater) {
            throwMismatch(sRepeater,pSVar12[-1].kind_);
            pSVar16 = (this->parsingStack).c.
                      super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            pSVar3 = (this->parsingStack).c.
                     super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
          }
          if (pSVar16 == pSVar3) goto LAB_00164de3;
          goto LAB_00164df3;
        }
        break;
      case sFixed:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        pSVar3 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar3 == (this->parsingStack).c.
                      super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar3 = (this->parsingStack).c.
                   super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        puVar4 = boost::any_cast<unsigned_long_const&>(&pSVar3[-1].extra_);
        Decoder::decodeFixed(&local_1c0,d,*puVar4);
        if (local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c0.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        break;
      case sEnum:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        (*d->_vptr_Decoder[0xf])(d);
        break;
      case sUnion:
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        iVar1 = (*d->_vptr_Decoder[0x16])(d);
        selectBranch(this,CONCAT44(extraout_var_01,iVar1));
        goto LAB_00165087;
      default:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Don\'t know how to skip ",0x17);
        std::operator<<((ostream *)local_1a8,
                        *(char **)(Symbol::stringValues + (ulong)pSVar19[-1].kind_ * 8));
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x18);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error((runtime_error *)(puVar10 + 1),(string *)local_1e0);
        *puVar10 = 0x17fa60;
        puVar10[1] = 0x17fa90;
        __cxa_throw(puVar10,&Exception::typeinfo,Exception::~Exception);
      case sRepeater:
        ptVar7 = boost::
                 any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                           (&pSVar19[-1].extra_);
        sVar8 = (ptVar7->super_type).head;
        if (sVar8 == 0) {
          lVar14 = 0xa0;
          if ((ptVar7->super_type).tail.head != false) {
            lVar14 = 0x88;
          }
          sVar8 = (**(code **)((long)d->_vptr_Decoder + lVar14))(d);
          (ptVar7->super_type).head = sVar8;
          if (sVar8 == 0) break;
        }
        (ptVar7->super_type).head = sVar8 - 1;
        peVar9 = (ptVar7->super_type).tail.tail.tail.head.px;
        for (pSVar17 = (peVar9->
                       super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pSVar17 !=
            (peVar9->
            super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
            _M_impl.super__Vector_impl_data._M_finish; pSVar17 = pSVar17 + 1) {
          std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (&this_00->c,pSVar17);
          peVar9 = (ptVar7->super_type).tail.tail.tail.head.px;
        }
        goto LAB_00165087;
      case sIndirect:
        psVar6 = boost::
                 any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                           (&pSVar19[-1].extra_);
        local_1a8 = (undefined1  [8])psVar6->px;
        local_1a0.pi_ = (psVar6->pn).pi_;
        if (local_1a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_1a0.pi_)->use_count_ = (local_1a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        for (pSVar17 = (((_Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                          *)local_1a8)->_M_impl).super__Vector_impl_data._M_start;
            pSVar17 !=
            (((_Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             local_1a8)->_M_impl).super__Vector_impl_data._M_finish; pSVar17 = pSVar17 + 1) {
          std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (&this_00->c,pSVar17);
        }
        goto LAB_00164fd5;
      case sSymbolic:
        pwVar5 = boost::
                 any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                           (&pSVar19[-1].extra_);
        local_1e0[0].px = pwVar5->px;
        local_1e0[0].pn.pi_ = (pwVar5->pn).pi_;
        if (local_1e0[0].pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_1e0[0].pn.pi_)->weak_count_ = (local_1e0[0].pn.pi_)->weak_count_ + 1;
          UNLOCK();
        }
        boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
        ::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                    *)local_1a8,local_1e0);
        boost::detail::weak_count::~weak_count(&local_1e0[0].pn);
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                  (&this_00->c);
        for (pSVar17 = (((_Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                          *)local_1a8)->_M_impl).super__Vector_impl_data._M_start;
            pSVar17 !=
            (((_Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *)
             local_1a8)->_M_impl).super__Vector_impl_data._M_finish; pSVar17 = pSVar17 + 1) {
          std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                    (&this_00->c,pSVar17);
        }
LAB_00164fd5:
        boost::detail::shared_count::~shared_count(&local_1a0);
        goto LAB_00165087;
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
LAB_00165087:
      ppSVar2 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      pSVar19 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      pSVar11 = (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar18 <= ((long)(this->parsingStack).c.
                              super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->parsingStack).c.
                              super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                       ((long)pSVar19 - (long)pSVar11 >> 4) +
                       ((((ulong)((long)ppSVar2 -
                                 (long)(this->parsingStack).c.
                                       super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                       + (ulong)(ppSVar2 == (_Map_pointer)0x0)) * 0x20);
  }
  return;
}

Assistant:

void skip(Decoder& d) {
        const size_t sz = parsingStack.size();
        if (sz == 0) {
            throw Exception("Nothing to skip!");
        }
        while (parsingStack.size() >= sz) {
            Symbol& t = parsingStack.top();
            switch (t.kind()) {
            case Symbol::sNull:
                d.decodeNull();
                break;
            case Symbol::sBool:
                d.decodeBool();
                break;
            case Symbol::sInt:
                d.decodeInt();
                break;
            case Symbol::sLong:
                d.decodeLong();
                break;
            case Symbol::sFloat:
                d.decodeFloat();
                break;
            case Symbol::sDouble:
                d.decodeDouble();
                break;
            case Symbol::sString:
                d.skipString();
                break;
            case Symbol::sBytes:
                d.skipBytes();
                break;
            case Symbol::sArrayStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipArray();
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    if (n == 0) {
                        break;
                    }
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sArrayEnd:
                break;
            case Symbol::sMapStart:
                {
                    parsingStack.pop();
                    size_t n = d.skipMap();
                    if (n == 0) {
                        break;
                    }
                    assertMatch(Symbol::sRepeater, parsingStack.top().kind());
                    Symbol& t = parsingStack.top();
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    boost::tuples::get<0>(*p) = n;
                    continue;
                }
            case Symbol::sMapEnd:
                break;
            case Symbol::sFixed:
                {
                    parsingStack.pop();
                    Symbol& t = parsingStack.top();
                    d.decodeFixed(t.extra<size_t>());
                }
                break;
            case Symbol::sEnum:
                parsingStack.pop();
                d.decodeEnum();
                break;
            case Symbol::sUnion:
                {
                    parsingStack.pop();
                    size_t n = d.decodeUnionIndex();
                    selectBranch(n);
                    continue;
                }
            case Symbol::sRepeater:
                {
                    RepeaterInfo *p = t.extrap<RepeaterInfo>();
                    if (boost::tuples::get<0>(*p) == 0) {
                        boost::tuples::get<0>(*p) =
                            boost::tuples::get<1>(*p) ? d.arrayNext() :
                                d.mapNext();
                    }
                    if (boost::tuples::get<0>(*p) != 0) {
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<3>(*p));
                        continue;
                    }
                }
                break;
            case Symbol::sIndirect:
                {
                    ProductionPtr pp =
                        t.extra<ProductionPtr>();
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            case Symbol::sSymbolic:
                {
                    ProductionPtr pp(
                        t.extra<boost::weak_ptr<Production> >());
                    parsingStack.pop();
                    append(pp);
                }
                continue;
            default:
                {
                    std::ostringstream oss;
                    oss << "Don't know how to skip "
                        << Symbol::toString(t.kind());
                    throw Exception(oss.str());
                }
            }
            parsingStack.pop();
        }
    }